

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::SystemLauncher::getWindowsCommandLine
          (SystemLauncher *this,string *commandLine,bool foreground)

{
  byte in_CL;
  string *in_RDI;
  string *launch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  allocator<char> local_81;
  string local_80 [16];
  undefined8 in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_60 [32];
  string local_40 [38];
  undefined1 local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  if (local_19 == 0) {
    ::std::operator+(in_stack_ffffffffffffff98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff90);
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_81;
    __lhs = in_RDI;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_80,"cmd /S /C ",(allocator *)__rhs);
    ::std::operator+(__lhs,(char *)__rhs);
    ::std::operator+(__lhs,__rhs);
    ::std::operator+(__lhs,(char *)__rhs);
    ::std::__cxx11::string::~string(local_40);
    ::std::__cxx11::string::~string(local_60);
    ::std::__cxx11::string::~string(local_80);
    ::std::allocator<char>::~allocator(&local_81);
  }
  return in_RDI;
}

Assistant:

std::string SystemLauncher::getWindowsCommandLine(const std::string& commandLine,
                                                      bool foreground) const
    {
        std::string launch = foreground
                                 ? (std::string("cmd /S /C ") + "\"" + commandLine + "\"")
                                 : ("start \"\" " + commandLine);

        return launch;
    }